

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetFuncNormTol(void *kinmem,realtype fnormtol)

{
  realtype rVar1;
  realtype uround;
  KINMem kin_mem;
  realtype fnormtol_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetFuncNormTol","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else if (0.0 <= fnormtol) {
    if ((fnormtol != 0.0) || (NAN(fnormtol))) {
      *(realtype *)((long)kinmem + 0x18) = fnormtol;
    }
    else {
      rVar1 = SUNRpowerR(*kinmem,0.3333333333333333);
      *(realtype *)((long)kinmem + 0x18) = rVar1;
    }
    kinmem_local._4_4_ = 0;
  }
  else {
    KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetFuncNormTol","fnormtol < 0 illegal.");
    kinmem_local._4_4_ = -2;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetFuncNormTol(void *kinmem, realtype fnormtol)
{
  KINMem kin_mem;
  realtype uround;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetFuncNormTol", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (fnormtol < ZERO) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetFuncNormTol", MSG_BAD_FNORMTOL);
    return(KIN_ILL_INPUT);
  }

  if (fnormtol == ZERO) {
    uround = kin_mem->kin_uround;
    kin_mem->kin_fnormtol = SUNRpowerR(uround,ONETHIRD);
  } else {
    kin_mem->kin_fnormtol = fnormtol;
  }

  return(KIN_SUCCESS);
}